

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::doEndBlock(SpillPointers *self,Expression **currp)

{
  LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this;
  Expression *pEVar1;
  BasicBlock *__from;
  map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::_Rb_tree_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  pVar5;
  Expression *local_40;
  map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  *local_38;
  
  pEVar1 = *currp;
  if (pEVar1->_id == BlockId) {
    if (pEVar1[1].type.id != 0) {
      p_Var3 = &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                .
                super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                .branches._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var2 = p_Var3;
      for (p_Var4 = *(_Base_ptr *)
                     ((long)&(self->
                             super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                             ).
                             super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                             .
                             super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                             .branches._M_t._M_impl.super__Rb_tree_header + 8);
          p_Var4 != (_Base_ptr)0x0;
          p_Var4 = (&p_Var4->_M_left)[*(Expression **)(p_Var4 + 1) < pEVar1]) {
        if (*(Expression **)(p_Var4 + 1) >= pEVar1) {
          p_Var2 = p_Var4;
        }
      }
      p_Var4 = p_Var3;
      if ((p_Var2 != p_Var3) && (p_Var4 = p_Var2, pEVar1 < *(Expression **)(p_Var2 + 1))) {
        p_Var4 = p_Var3;
      }
      if ((p_Var4 != p_Var3) && (p_Var4[1]._M_left != p_Var4[1]._M_parent)) {
        this = &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
        ;
        local_38 = &(self->
                    super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                    .
                    super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                    .branches;
        __from = (self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                 .
                 super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                 .currBasicBlock;
        startBasicBlock(&this->
                         super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                       );
        link(&this->
              super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
             ,(char *)__from,
             (char *)(self->
                     super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                     .
                     super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                     .currBasicBlock);
        p_Var2 = p_Var4[1]._M_left;
        for (p_Var3 = p_Var4[1]._M_parent; this_00 = local_38, p_Var3 != p_Var2;
            p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
          link(&this->
                super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
               ,*(char **)p_Var3,
               (char *)(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                       .
                       super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                       .currBasicBlock);
        }
        local_40 = pEVar1;
        pVar5 = std::
                _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                ::equal_range(&local_38->_M_t,&local_40);
        std::
        _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node
                      );
      }
    }
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Block]");
}

Assistant:

static void doEndBlock(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Block>();
    if (!curr->name.is()) {
      return;
    }
    auto iter = self->branches.find(curr);
    if (iter == self->branches.end()) {
      return;
    }
    auto& origins = iter->second;
    if (origins.size() == 0) {
      return;
    }
    // we have branches to here, so we need a new block
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    self->link(last, self->currBasicBlock); // fallthrough
    // branches to the new one
    for (auto* origin : origins) {
      self->link(origin, self->currBasicBlock);
    }
    self->branches.erase(curr);
  }